

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell::createTest
          (TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell *this)

{
  Utest *this_00;
  TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_TestShell *this_local;
  
  this_00 = (Utest *)operator_new(8,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                                  ,0x1d8);
  TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_Test::
  TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_Test
            ((TEST_MockComparatorCopierTest_customObjectWithFunctionCopier_Test *)this_00);
  return this_00;
}

Assistant:

TEST(MockComparatorCopierTest, customObjectWithFunctionCopier)
{
    MyTypeForTesting expectedObject(9874452);
    MyTypeForTesting actualObject(2034);
    MockFunctionCopier copier(myTypeCopy);
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("function").withOutputParameterOfTypeReturning("MyTypeForTesting", "parameterName", &expectedObject);
    mock().actualCall("function").withOutputParameterOfType("MyTypeForTesting", "parameterName", &actualObject);

    mock().checkExpectations();
    CHECK_EQUAL(9874452, *(expectedObject.value));
    CHECK_EQUAL(9874452, *(actualObject.value));

    mock().removeAllComparatorsAndCopiers();
}